

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O0

bool __thiscall
cmRuntimeDependencyArchive::IsPostExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  bool bVar1;
  reference pRVar2;
  char *pcVar3;
  RegularExpression *regex_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range1_1;
  RegularExpression *regex;
  iterator __end1;
  iterator __begin1;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range1;
  RegularExpressionMatch match;
  string *name_local;
  cmRuntimeDependencyArchive *this_local;
  
  match.searchstring = (char *)name;
  cmsys::RegularExpressionMatch::RegularExpressionMatch((RegularExpressionMatch *)&__range1);
  __end1 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::begin
                     (&this->PostIncludeRegexes);
  regex = (RegularExpression *)
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                    (&this->PostIncludeRegexes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                *)&regex);
    if (!bVar1) {
      __end1_1 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
                 begin(&this->PostExcludeRegexes);
      regex_1 = (RegularExpression *)
                std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
                end(&this->PostExcludeRegexes);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                            *)&regex_1);
        if (!bVar1) {
          return false;
        }
        pRVar2 = __gnu_cxx::
                 __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                 ::operator*(&__end1_1);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::RegularExpression::find(pRVar2,pcVar3,(RegularExpressionMatch *)&__range1);
        if (bVar1) break;
        __gnu_cxx::
        __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
        ::operator++(&__end1_1);
      }
      return true;
    }
    pRVar2 = __gnu_cxx::
             __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
             ::operator*(&__end1);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::RegularExpression::find(pRVar2,pcVar3,(RegularExpressionMatch *)&__range1);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
    ::operator++(&__end1);
  }
  return false;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPostExcluded(const std::string& name)
{
  cmsys::RegularExpressionMatch match;

  for (auto const& regex : this->PostIncludeRegexes) {
    if (regex.find(name.c_str(), match)) {
      return false;
    }
  }

  for (auto const& regex : this->PostExcludeRegexes) {
    if (regex.find(name.c_str(), match)) {
      return true;
    }
  }

  return false;
}